

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_23::AggregateErrorCollector::RecordError
          (AggregateErrorCollector *this,int param_1,int param_2,string_view message)

{
  AlphaNum local_48;
  
  if ((this->error_)._M_string_length != 0) {
    local_48.piece_._M_len = 2;
    local_48.piece_._M_str = "; ";
    absl::lts_20240722::StrAppend((string *)&this->error_,&local_48);
  }
  local_48.piece_._M_len = message._M_len;
  local_48.piece_._M_str = message._M_str;
  absl::lts_20240722::StrAppend((string *)&this->error_,&local_48);
  return;
}

Assistant:

void RecordError(int /* line */, int /* column */,
                   const absl::string_view message) override {
    if (!error_.empty()) {
      absl::StrAppend(&error_, "; ");
    }
    absl::StrAppend(&error_, message);
  }